

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestFieldOrderings::~TestFieldOrderings(TestFieldOrderings *this)

{
  ~TestFieldOrderings(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TestFieldOrderings::~TestFieldOrderings() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestFieldOrderings)
  SharedDtor(*this);
}